

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.h
# Opt level: O0

SourceContext * __thiscall google::protobuf::Enum::_internal_mutable_source_context(Enum *this)

{
  Arena *arena;
  SourceContext *pSVar1;
  SourceContext *p;
  Enum *this_local;
  
  if ((this->field_0)._impl_.source_context_ == (SourceContext *)0x0) {
    arena = MessageLite::GetArena((MessageLite *)this);
    pSVar1 = (SourceContext *)Arena::DefaultConstruct<google::protobuf::SourceContext>(arena);
    (this->field_0)._impl_.source_context_ = pSVar1;
  }
  return (this->field_0)._impl_.source_context_;
}

Assistant:

inline ::google::protobuf::SourceContext* Enum::_internal_mutable_source_context() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.source_context_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::SourceContext>(GetArena());
    _impl_.source_context_ = reinterpret_cast<::google::protobuf::SourceContext*>(p);
  }
  return _impl_.source_context_;
}